

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::VerifyMark(LargeHeapBlock *this)

{
  LargeObjectHeader *address;
  Recycler *this_00;
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  LargeObjectHeader *pLVar6;
  uint index;
  LargeObjectHeader **ppLVar7;
  
  if ((this->super_HeapBlock).needOOMRescan == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x3db,"(!this->needOOMRescan)","!this->needOOMRescan");
    if (!bVar3) {
LAB_006f1df0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (this->allocCount != 0) {
    this_00 = this->heapInfo->recycler;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    index = 0;
    do {
      pLVar6 = GetHeaderByIndex(this,index);
      if (pLVar6 != (LargeObjectHeader *)0x0) {
        address = pLVar6 + 1;
        bVar3 = HeapBlockMap64::IsMarked(&this_00->heapBlockMap,address);
        if (bVar3) {
          bVar4 = LargeObjectHeader::GetAttributes(pLVar6,this->heapInfo->recycler->Cookie);
          if ((bVar4 & 4) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                               ,0x3ee,"((attributes & NewFinalizeBit) == 0)",
                               "(attributes & NewFinalizeBit) == 0");
            if (!bVar3) goto LAB_006f1df0;
            *puVar5 = 0;
          }
          if ((bVar4 & 0x20) == 0) {
            if ((pLVar6->field_0x1a & 1) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                 ,0x3f5,"(!header->markOnOOMRescan)","!header->markOnOOMRescan");
              if (!bVar3) goto LAB_006f1df0;
              *puVar5 = 0;
            }
            sVar1 = pLVar6->objectSize;
            ppLVar7 = (LargeObjectHeader **)&pLVar6[1].objectSize;
            pLVar6 = address;
            while (ppLVar7 <= (char *)((long)&address->objectIndex + sVar1)) {
              bVar3 = Recycler::VerifyMark(this_00,pLVar6,*(void **)pLVar6);
              if (((bVar3) && (DAT_015d641e == '\x01')) && (DAT_015d641f == '\x01')) {
                WBVerifyBitIsSet(this,(char *)pLVar6);
              }
              ppLVar7 = &pLVar6->next;
              pLVar6 = (LargeObjectHeader *)&pLVar6->objectSize;
            }
          }
        }
      }
      index = index + 1;
    } while (index < this->allocCount);
  }
  return;
}

Assistant:

void
LargeHeapBlock::VerifyMark()
{
    Assert(!this->needOOMRescan);
    Recycler* recycler = this->heapInfo->recycler;

    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->GetHeaderByIndex(i);
        if (header == nullptr)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();
        if (!recycler->heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        unsigned char attributes = header->GetAttributes(this->heapInfo->recycler->Cookie);

        Assert((attributes & NewFinalizeBit) == 0);

        if ((attributes & LeafBit) != 0)
        {
            continue;
        }

        Assert(!header->markOnOOMRescan);

        char * objectAddressEnd = objectAddress + header->objectSize;

        while (objectAddress + sizeof(void *) <= objectAddressEnd)
        {
            void* target = *(void **)objectAddress;

            if (recycler->VerifyMark(objectAddress, target))
            {
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
                if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
                {
                    this->WBVerifyBitIsSet(objectAddress);
                }
#endif
            }

            objectAddress += sizeof(void *);
        }
    }
}